

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_create_trap(command *cmd)

{
  loc grid;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  loc grid_03;
  _Bool _Var1;
  wchar_t wVar2;
  trap_kind_conflict *ptVar3;
  object *poVar4;
  char *fmt;
  wchar_t tidx;
  char s [80];
  
  wVar2 = cmd_get_arg_number((command_conflict *)cmd,"index",&tidx);
  if (wVar2 != L'\0') {
    s[0x40] = '\0';
    s[0x41] = '\0';
    s[0x42] = '\0';
    s[0x43] = '\0';
    s[0x44] = '\0';
    s[0x45] = '\0';
    s[0x46] = '\0';
    s[0x47] = '\0';
    s[0x48] = '\0';
    s[0x49] = '\0';
    s[0x4a] = '\0';
    s[0x4b] = '\0';
    s[0x4c] = '\0';
    s[0x4d] = '\0';
    s[0x4e] = '\0';
    s[0x4f] = '\0';
    s[0x30] = '\0';
    s[0x31] = '\0';
    s[0x32] = '\0';
    s[0x33] = '\0';
    s[0x34] = '\0';
    s[0x35] = '\0';
    s[0x36] = '\0';
    s[0x37] = '\0';
    s[0x38] = '\0';
    s[0x39] = '\0';
    s[0x3a] = '\0';
    s[0x3b] = '\0';
    s[0x3c] = '\0';
    s[0x3d] = '\0';
    s[0x3e] = '\0';
    s[0x3f] = '\0';
    s[0x20] = '\0';
    s[0x21] = '\0';
    s[0x22] = '\0';
    s[0x23] = '\0';
    s[0x24] = '\0';
    s[0x25] = '\0';
    s[0x26] = '\0';
    s[0x27] = '\0';
    s[0x28] = '\0';
    s[0x29] = '\0';
    s[0x2a] = '\0';
    s[0x2b] = '\0';
    s[0x2c] = '\0';
    s[0x2d] = '\0';
    s[0x2e] = '\0';
    s[0x2f] = '\0';
    s[0x10] = '\0';
    s[0x11] = '\0';
    s[0x12] = '\0';
    s[0x13] = '\0';
    s[0x14] = '\0';
    s[0x15] = '\0';
    s[0x16] = '\0';
    s[0x17] = '\0';
    s[0x18] = '\0';
    s[0x19] = '\0';
    s[0x1a] = '\0';
    s[0x1b] = '\0';
    s[0x1c] = '\0';
    s[0x1d] = '\0';
    s[0x1e] = '\0';
    s[0x1f] = '\0';
    s[0] = '\0';
    s[1] = '\0';
    s[2] = '\0';
    s[3] = '\0';
    s[4] = '\0';
    s[5] = '\0';
    s[6] = '\0';
    s[7] = '\0';
    s[8] = '\0';
    s[9] = '\0';
    s[10] = '\0';
    s[0xb] = '\0';
    s[0xc] = '\0';
    s[0xd] = '\0';
    s[0xe] = '\0';
    s[0xf] = '\0';
    _Var1 = get_string("Create which trap? ",s,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string(s,&tidx);
    if (!_Var1) {
      ptVar3 = lookup_trap(s);
      if (ptVar3 == (trap_kind_conflict *)0x0) {
        tidx = (wchar_t)z_info->trap_max;
      }
      else {
        tidx = ptVar3->tidx;
      }
    }
    cmd_set_arg_number((command_conflict *)cmd,"index",tidx);
  }
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  _Var1 = square_isfloor(cave,grid);
  if ((((!_Var1) ||
       (grid_00.x = (player->grid).x, grid_00.y = (player->grid).y,
       _Var1 = square_isplayertrap(cave,grid_00), _Var1)) ||
      (grid_01.x = (player->grid).x, grid_01.y = (player->grid).y,
      _Var1 = square_iswebbed(cave,grid_01), _Var1)) ||
     (grid_02.x = (player->grid).x, grid_02.y = (player->grid).y,
     poVar4 = square_object(cave,grid_02), poVar4 != (object *)0x0)) {
    fmt = "You can\'t place a trap there!";
  }
  else if (player->depth == 0) {
    fmt = "You can\'t place a trap in the town!";
  }
  else {
    if ((L'\0' < tidx) && ((uint)tidx < (uint)z_info->trap_max)) {
      grid_03.x = (player->grid).x;
      grid_03.y = (player->grid).y;
      place_trap((chunk *)cave,grid_03,tidx,L'\0');
      cmd_disable_repeat();
      return;
    }
    fmt = "Trap not found.";
  }
  msg(fmt);
  return;
}

Assistant:

void do_cmd_wiz_create_trap(struct command *cmd)
{
	int tidx;

	if (cmd_get_arg_number(cmd, "index", &tidx) != CMD_OK) {
		char s[80] = "";

		if (!get_string("Create which trap? ", s, sizeof(s))) return;
		if (!get_int_from_string(s, &tidx)) {
			const struct trap_kind *trap = lookup_trap(s);

			tidx = (trap) ? trap->tidx : z_info->trap_max;
		}
		cmd_set_arg_number(cmd, "index", tidx);
	}

	if (!square_isfloor(cave, player->grid)
			|| square_isplayertrap(cave, player->grid)
			|| square_iswebbed(cave, player->grid)
			|| square_object(cave, player->grid)) {
		msg("You can't place a trap there!");
	} else if (player->depth == 0) {
		msg("You can't place a trap in the town!");
	} else if (tidx < 1 || tidx >= z_info->trap_max) {
		msg("Trap not found.");
	} else {
		place_trap(cave, player->grid, tidx, 0);
		/* Can not repeat since there's now a trap here. */
		cmd_disable_repeat();
	}
}